

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_compile.c
# Opt level: O1

LY_ERR lys_compile_unres_check_disabled(lysc_node *node)

{
  lysc_node *plVar1;
  long lVar2;
  LY_ERR LVar3;
  char *pcVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong unaff_R15;
  
  if ((node->flags & 0x100) == 0) {
    for (plVar1 = node->parent; plVar1 != (lysc_node *)0x0; plVar1 = plVar1->parent) {
      if (plVar1->nodetype == 0x10) {
        pcVar4 = plVar1[1].name;
        uVar7 = 0;
        while( true ) {
          if (pcVar4 == (char *)0x0) {
            uVar5 = 0;
          }
          else {
            uVar5 = *(ulong *)(pcVar4 + -8);
          }
          if (uVar5 <= uVar7) break;
          lVar2 = *(long *)(pcVar4 + uVar7 * 8);
          unaff_R15 = 0;
          while( true ) {
            if (lVar2 == 0) {
              uVar6 = 0;
            }
            else {
              uVar6 = *(ulong *)(lVar2 + -8);
            }
            if (uVar6 <= unaff_R15) break;
            if (*(lysc_node **)(lVar2 + unaff_R15 * 8) == node) goto LAB_00144f76;
            unaff_R15 = unaff_R15 + 1;
          }
          uVar7 = uVar7 + 1;
        }
LAB_00144f76:
        if (uVar7 < uVar5) {
          lVar2 = *(long *)(pcVar4 + uVar7 * 8);
          if (lVar2 == 0) {
LAB_00144fd4:
            pcVar4 = plVar1[1].name;
            if (pcVar4 != (char *)0x0) {
              uVar5 = *(ulong *)(pcVar4 + -8);
              if (1 < uVar5) {
                if (uVar7 < uVar5 - 1) {
                  memmove(pcVar4 + uVar7 * 8,pcVar4 + uVar7 * 8 + 8,(uVar5 + ~uVar7) * 8);
                }
                pcVar4 = plVar1[1].name;
                goto LAB_00145012;
              }
              if (pcVar4 != (char *)0x0) {
                free(pcVar4 + -8);
              }
            }
            plVar1[1].name = (char *)0x0;
          }
          else {
            uVar5 = *(ulong *)(lVar2 + -8);
            if (uVar5 < 2) {
              if (lVar2 != 0) {
                free((void *)(lVar2 + -8));
              }
              goto LAB_00144fd4;
            }
            if (unaff_R15 < uVar5 - 1) {
              memmove((void *)(lVar2 + unaff_R15 * 8),(void *)(lVar2 + unaff_R15 * 8 + 8),
                      (uVar5 + ~unaff_R15) * 8);
            }
            pcVar4 = *(char **)(plVar1[1].name + uVar7 * 8);
LAB_00145012:
            *(long *)(pcVar4 + -8) = *(long *)(pcVar4 + -8) + -1;
          }
        }
      }
    }
    LVar3 = LY_SUCCESS;
  }
  else {
    ly_log_location(node,(lyd_node *)0x0,(char *)0x0,(ly_in *)0x0);
    ly_vlog(node->module->ctx,(char *)0x0,LYVE_REFERENCE,"Key \"%s\" is disabled.",node->name);
    ly_log_location_revert(1,0,0,0);
    LVar3 = LY_EVALID;
  }
  return LVar3;
}

Assistant:

static LY_ERR
lys_compile_unres_check_disabled(const struct lysc_node *node)
{
    const struct lysc_node *parent;
    struct lysc_node_list *slist;
    LY_ARRAY_COUNT_TYPE u, v;
    int found;

    if (node->flags & LYS_KEY) {
        LOG_LOCSET(node, NULL);
        LOGVAL(node->module->ctx, LYVE_REFERENCE, "Key \"%s\" is disabled.", node->name);
        LOG_LOCBACK(1, 0);
        return LY_EVALID;
    }

    for (parent = node->parent; parent; parent = parent->parent) {
        if (parent->nodetype != LYS_LIST) {
            continue;
        }

        /* check and fix list uniques */
        slist = (struct lysc_node_list *)parent;
        found = 0;
        LY_ARRAY_FOR(slist->uniques, u) {
            LY_ARRAY_FOR(slist->uniques[u], v) {
                if (slist->uniques[u][v] == (struct lysc_node_leaf *)node) {
                    found = 1;
                    break;
                }
            }

            if (found) {
                break;
            }
        }

        if (found) {
            if (LY_ARRAY_COUNT(slist->uniques[u]) > 1) {
                /* remove the item */
                if (v < LY_ARRAY_COUNT(slist->uniques[u]) - 1) {
                    memmove(&slist->uniques[u][v], &slist->uniques[u][v + 1],
                            (LY_ARRAY_COUNT(slist->uniques[u]) - v - 1) * sizeof slist->uniques[u][v]);
                }
                LY_ARRAY_DECREMENT(slist->uniques[u]);
            } else {
                /* remove the whole unique array */
                LY_ARRAY_FREE(slist->uniques[u]);
                if (LY_ARRAY_COUNT(slist->uniques) > 1) {
                    if (u < LY_ARRAY_COUNT(slist->uniques) - 1) {
                        memmove(&slist->uniques[u], &slist->uniques[u + 1],
                                (LY_ARRAY_COUNT(slist->uniques) - u - 1) * sizeof slist->uniques[u]);
                    }
                    LY_ARRAY_DECREMENT(slist->uniques);
                } else {
                    LY_ARRAY_FREE(slist->uniques);
                    slist->uniques = NULL;
                }
            }
        }
    }

    return LY_SUCCESS;
}